

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O0

void plutovg_canvas_save(plutovg_canvas_t *canvas)

{
  plutovg_state_t *local_18;
  plutovg_state_t *new_state;
  plutovg_canvas_t *canvas_local;
  
  local_18 = canvas->freed_state;
  if (local_18 == (plutovg_state_t *)0x0) {
    local_18 = plutovg_state_create();
  }
  else {
    canvas->freed_state = local_18->next;
  }
  plutovg_state_copy(local_18,canvas->state);
  local_18->next = canvas->state;
  canvas->state = local_18;
  return;
}

Assistant:

void plutovg_canvas_save(plutovg_canvas_t* canvas)
{
    plutovg_state_t* new_state = canvas->freed_state;
    if(new_state == NULL)
        new_state = plutovg_state_create();
    else
        canvas->freed_state = new_state->next;
    plutovg_state_copy(new_state, canvas->state);
    new_state->next = canvas->state;
    canvas->state = new_state;
}